

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O1

void helper_msa_st_d_mipsel(CPUMIPSState_conflict2 *env,uint32_t wd,target_ulong_conflict addr)

{
  uint uVar1;
  uintptr_t unaff_retaddr;
  
  uVar1 = 3;
  if ((env->hflags >> 0x1c & 1) == 0) {
    uVar1 = env->hflags & 3;
  }
  if (0xff0 < (addr & 0xfff)) {
    helper_msa_st_d_mipsel_cold_1();
  }
  helper_le_stq_mmu_mipsel
            ((CPUArchState_conflict8 *)env,addr,(env->active_fpu).fpr[wd].d,uVar1 | 0x730,
             unaff_retaddr);
  helper_le_stq_mmu_mipsel
            ((CPUArchState_conflict8 *)env,addr + 8,
             *(uint64_t *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8),uVar1 | 0x730,
             unaff_retaddr);
  return;
}

Assistant:

void helper_msa_st_d(CPUMIPSState *env, uint32_t wd,
                     target_ulong addr)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    int mmu_idx = cpu_mmu_index(env, false);

    MEMOP_IDX(DF_DOUBLE)
    ensure_writable_pages(env, addr, mmu_idx, GETPC());
    helper_ret_stq_mmu(env, addr + (0 << DF_DOUBLE), pwd->d[0], oi, GETPC());
    helper_ret_stq_mmu(env, addr + (1 << DF_DOUBLE), pwd->d[1], oi, GETPC());
}